

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

void __thiscall QMakeEvaluator::skipExpression(QMakeEvaluator *this,ushort **pTokPtr)

{
  undefined2 uVar1;
  long lVar2;
  QMakeEvaluator *pQVar3;
  QMakeEvaluator *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  ushort tok;
  uint len;
  uint len_2;
  uint len_1;
  ushort *tokPtr;
  undefined6 in_stack_ffffffffffffffa8;
  QMakeEvaluator *local_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RSI->m_caller;
  do {
    local_10 = pQVar3;
    pQVar3 = (QMakeEvaluator *)((long)&local_10->m_caller + 2);
    uVar1 = *(undefined2 *)&local_10->m_caller;
    switch(uVar1) {
    case 1:
      *(undefined2 *)(in_RDI + 0x18) = *(undefined2 *)&pQVar3->m_caller;
      pQVar3 = (QMakeEvaluator *)((long)&local_10->m_caller + 4);
      break;
    default:
      switch((char)uVar1) {
      case '\b':
      case '\f':
        pQVar3 = (QMakeEvaluator *)
                 ((long)&local_10->m_caller + (ulong)*(ushort *)&pQVar3->m_caller * 2 + 4);
        break;
      case '\t':
      case '\n':
      case '\v':
        pQVar3 = (QMakeEvaluator *)
                 ((long)&local_10->m_debugLevel +
                 (ulong)*(ushort *)((long)&local_10->m_caller + 6) * 2);
        break;
      case '\r':
        in_RSI->m_caller =
             (QMakeEvaluator *)
             ((long)&local_10->m_debugLevel + (ulong)*(ushort *)((long)&local_10->m_caller + 6) * 2)
        ;
        skipExpression(in_RSI,(ushort **)
                              CONCAT17((char)((ushort)uVar1 >> 8),
                                       CONCAT16((char)uVar1,in_stack_ffffffffffffffa8)));
        pQVar3 = in_RSI->m_caller;
      }
      break;
    case 7:
    case 0xf:
      in_RSI->m_caller = pQVar3;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      __stack_chk_fail();
    case 0xe:
    }
  } while( true );
}

Assistant:

void QMakeEvaluator::skipExpression(const ushort *&pTokPtr)
{
    const ushort *tokPtr = pTokPtr;
    forever {
        ushort tok = *tokPtr++;
        switch (tok) {
        case TokLine:
            m_current.line = *tokPtr++;
            break;
        case TokValueTerminator:
        case TokFuncTerminator:
            pTokPtr = tokPtr;
            return;
        case TokArgSeparator:
            break;
        default:
            switch (tok & TokMask) {
            case TokLiteral:
            case TokEnvVar:
                skipStr(tokPtr);
                break;
            case TokHashLiteral:
            case TokVariable:
            case TokProperty:
                skipHashStr(tokPtr);
                break;
            case TokFuncName:
                skipHashStr(tokPtr);
                pTokPtr = tokPtr;
                skipExpression(pTokPtr);
                tokPtr = pTokPtr;
                break;
            default:
                Q_ASSERT_X(false, "skipExpression", "Unrecognized token");
                break;
            }
        }
    }